

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSTime.h
# Opt level: O2

int StopChrono(CHRONO *pChrono,double *pDuration)

{
  int iVar1;
  timespec local_20;
  
  if (pChrono->Suspended == 0) {
    iVar1 = clock_gettime(4,&local_20);
    if (iVar1 != 0) {
      return 1;
    }
    (pChrono->Finish).tv_sec = local_20.tv_sec;
    (pChrono->Finish).tv_nsec = local_20.tv_nsec;
    local_20.tv_nsec = local_20.tv_nsec + (pChrono->Duration).tv_nsec;
    local_20.tv_sec =
         (local_20.tv_nsec / 1000000000 + local_20.tv_sec + (pChrono->Duration).tv_sec) -
         (pChrono->Start).tv_sec;
    local_20.tv_nsec = local_20.tv_nsec % 1000000000 - (pChrono->Start).tv_nsec;
    if (local_20.tv_nsec < 0) {
      local_20.tv_sec = local_20.tv_sec + ~((ulong)-local_20.tv_nsec / 1000000000);
      local_20.tv_nsec = 1000000000 - (ulong)-local_20.tv_nsec % 1000000000;
    }
    (pChrono->Duration).tv_sec = local_20.tv_sec;
    (pChrono->Duration).tv_nsec = local_20.tv_nsec;
  }
  *pDuration = (double)(pChrono->Duration).tv_nsec / 1000000000.0 +
               (double)(pChrono->Duration).tv_sec;
  return 0;
}

Assistant:

inline int StopChrono(CHRONO* pChrono, double* pDuration)
{
	struct timespec temp;

	if (pChrono->Suspended)
	{
		*pDuration = pChrono->Duration.tv_sec+(double)pChrono->Duration.tv_nsec/1000000000.0;
	}
	else
	{
		if (clock_gettime(CLOCK_MONOTONIC_RAW, &temp) != EXIT_SUCCESS)
		{
			PRINT_DEBUG_ERROR_OSTIME(("StopChrono error (%s) : %s"
				"(pChrono=%#x)\n", 
				strtime_m(), 
				GetLastErrorMsg(), 
				pChrono));
			return EXIT_FAILURE;
		}

		//pChrono->Duration += pChrono->Finish-pChrono->Start

		pChrono->Finish = temp;

		temp.tv_sec += pChrono->Duration.tv_sec; // Seconds.
		temp.tv_nsec += pChrono->Duration.tv_nsec; // Additional nanoseconds.
		// tv_nsec must stay in [0,1000000000].
		temp.tv_sec += temp.tv_nsec/1000000000;
		temp.tv_nsec = temp.tv_nsec%1000000000;

		temp.tv_sec -= pChrono->Start.tv_sec;
		temp.tv_nsec -= pChrono->Start.tv_nsec;
		// tv_nsec must stay in [0,1000000000].
		if (temp.tv_nsec < 0)
		{
			temp.tv_sec += -1+temp.tv_nsec/1000000000;
			temp.tv_nsec = 1000000000+temp.tv_nsec%1000000000;
		}

		pChrono->Duration = temp;

		*pDuration = pChrono->Duration.tv_sec+(double)pChrono->Duration.tv_nsec/1000000000.0;
	}

	return EXIT_SUCCESS;
}